

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDeclsCtx::addTag
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *this,size_t param_3,char *param_4
          ,vector<wasm::Name,_std::allocator<wasm::Name>_> *exports,ImportNames *import,
          Index param_7)

{
  Module *wasm;
  Name name;
  Err *pEVar1;
  Tag **ppTVar2;
  size_type sVar3;
  bool bVar4;
  Ok local_1b9;
  value_type local_1b8;
  Err local_188;
  Err *local_168;
  Err *err_2;
  Result<wasm::Ok> _val_2;
  Err *err_1;
  Result<wasm::Tag_*> _val_1;
  undefined1 local_d0 [8];
  Result<wasm::Tag_*> t;
  Err local_a0;
  Err *local_70;
  Err *err;
  Result<wasm::Ok> _val;
  ImportNames *import_local;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *exports_local;
  ParseDeclsCtx *this_local;
  Name name_local;
  
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _32_8_ = import;
  checkImport((Result<wasm::Ok> *)&err,this,param_7,import);
  local_70 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  t.val.super__Variant_base<wasm::Tag_*,_wasm::Err>.super__Move_assign_alias<wasm::Tag_*,_wasm::Err>
  .super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
  super__Variant_storage_alias<wasm::Tag_*,_wasm::Err>._36_1_ = local_70 != (Err *)0x0;
  if ((bool)t.val.super__Variant_base<wasm::Tag_*,_wasm::Err>.
            super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
            super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.
            super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
            super__Variant_storage_alias<wasm::Tag_*,_wasm::Err>._36_1_) {
    wasm::Err::Err(&local_a0,local_70);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_a0);
    wasm::Err::~Err(&local_a0);
  }
  t.val.super__Variant_base<wasm::Tag_*,_wasm::Err>.super__Move_assign_alias<wasm::Tag_*,_wasm::Err>
  .super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
  super__Variant_storage_alias<wasm::Tag_*,_wasm::Err>._37_3_ = 0;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (t.val.super__Variant_base<wasm::Tag_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Tag_*,_wasm::Err>._36_4_ == 0) {
    name.super_IString.str._M_str = param_4;
    name.super_IString.str._M_len = param_3;
    _val_1.val.super__Variant_base<wasm::Tag_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Tag_*,_wasm::Err>._32_8_ = param_3;
    addTagDecl((Result<wasm::Tag_*> *)local_d0,this,param_7,name,
               (ImportNames *)
               _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_);
    Result<wasm::Tag_*>::Result((Result<wasm::Tag_*> *)&err_1,(Result<wasm::Tag_*> *)local_d0);
    pEVar1 = Result<wasm::Tag_*>::getErr((Result<wasm::Tag_*> *)&err_1);
    if (pEVar1 != (Err *)0x0) {
      wasm::Err::Err((Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar1);
      Result<wasm::Ok>::Result
                (__return_storage_ptr__,
                 (Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      wasm::Err::~Err((Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    }
    t.val.super__Variant_base<wasm::Tag_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Tag_*,_wasm::Err>._37_3_ = 0;
    t.val.super__Variant_base<wasm::Tag_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Tag_*,_wasm::Err>._36_1_ = pEVar1 != (Err *)0x0;
    Result<wasm::Tag_*>::~Result((Result<wasm::Tag_*> *)&err_1);
    if (t.val.super__Variant_base<wasm::Tag_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Tag_*,_wasm::Err>._36_4_ == 0) {
      wasm = this->wasm;
      ppTVar2 = Result<wasm::Tag_*>::operator*((Result<wasm::Tag_*> *)local_d0);
      anon_unknown_5::addExports
                ((Result<wasm::Ok> *)&err_2,&this->in,wasm,(Named *)*ppTVar2,exports,Tag);
      local_168 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_2);
      bVar4 = local_168 != (Err *)0x0;
      if (bVar4) {
        wasm::Err::Err(&local_188,local_168);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_188);
        wasm::Err::~Err(&local_188);
      }
      t.val.super__Variant_base<wasm::Tag_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Tag_*,_wasm::Err>._37_3_ = 0;
      t.val.super__Variant_base<wasm::Tag_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Tag_*,_wasm::Err>._36_1_ = bVar4;
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_2);
      if (t.val.super__Variant_base<wasm::Tag_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Tag_*,_wasm::Err>._36_4_ == 0) {
        local_1b8.pos = param_7;
        local_1b8.name.super_IString.str._M_len = param_3;
        local_1b8.name.super_IString.str._M_str = param_4;
        sVar3 = std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::size
                          (&this->tagDefs);
        local_1b8.index = (Index)sVar3;
        local_1b8.annotations.
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1b8.annotations.
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1b8.annotations.
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
        vector(&local_1b8.annotations);
        std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::push_back
                  (&this->tagDefs,&local_1b8);
        DefPos::~DefPos(&local_1b8);
        Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_1b9);
        t.val.super__Variant_base<wasm::Tag_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Tag_*,_wasm::Err>._36_4_ = 1;
      }
    }
    Result<wasm::Tag_*>::~Result((Result<wasm::Tag_*> *)local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> ParseDeclsCtx::addTag(Name name,
                               const std::vector<Name>& exports,
                               ImportNames* import,
                               TypeUseT type,
                               Index pos) {
  CHECK_ERR(checkImport(pos, import));
  auto t = addTagDecl(pos, name, import);
  CHECK_ERR(t);
  CHECK_ERR(addExports(in, wasm, *t, exports, ExternalKind::Tag));
  // TODO: tag annotations
  tagDefs.push_back({name, pos, Index(tagDefs.size()), {}});
  return Ok{};
}